

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImDrawDataBuilder::FlattenIntoSingleLayer(ImDrawDataBuilder *this)

{
  int *piVar1;
  int iVar2;
  ImDrawList **ppIVar3;
  int iVar4;
  ImDrawList **ppIVar5;
  int iVar6;
  int iVar7;
  
  iVar2 = this->Layers[0].Size;
  iVar4 = this->Layers[1].Size;
  iVar7 = this->Layers[0].Capacity;
  iVar6 = iVar4 + iVar2;
  if (iVar7 < iVar6) {
    if (iVar7 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar7 / 2 + iVar7;
    }
    if (iVar7 <= iVar6) {
      iVar7 = iVar6;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    ppIVar5 = (ImDrawList **)(*GImAllocatorAllocFunc)((long)iVar7 << 3,GImAllocatorUserData);
    ppIVar3 = this->Layers[0].Data;
    if (ppIVar3 != (ImDrawList **)0x0) {
      memcpy(ppIVar5,ppIVar3,(long)this->Layers[0].Size << 3);
      ppIVar3 = this->Layers[0].Data;
      if ((ppIVar3 != (ImDrawList **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar3,GImAllocatorUserData);
    }
    this->Layers[0].Data = ppIVar5;
    this->Layers[0].Capacity = iVar7;
    iVar4 = this->Layers[1].Size;
  }
  this->Layers[0].Size = iVar6;
  if (iVar4 != 0) {
    memcpy(this->Layers[0].Data + iVar2,this->Layers[1].Data,(long)iVar4 << 3);
    if (this->Layers[1].Capacity < 0) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      ppIVar5 = (ImDrawList **)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
      ppIVar3 = this->Layers[1].Data;
      if (ppIVar3 != (ImDrawList **)0x0) {
        memcpy(ppIVar5,ppIVar3,(long)this->Layers[1].Size << 3);
        ppIVar3 = this->Layers[1].Data;
        if ((ppIVar3 != (ImDrawList **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar3,GImAllocatorUserData);
      }
      this->Layers[1].Data = ppIVar5;
      this->Layers[1].Capacity = 0;
    }
    this->Layers[1].Size = 0;
  }
  return;
}

Assistant:

void ImDrawDataBuilder::FlattenIntoSingleLayer()
{
    int n = Layers[0].Size;
    int size = n;
    for (int i = 1; i < IM_ARRAYSIZE(Layers); i++)
        size += Layers[i].Size;
    Layers[0].resize(size);
    for (int layer_n = 1; layer_n < IM_ARRAYSIZE(Layers); layer_n++)
    {
        ImVector<ImDrawList*>& layer = Layers[layer_n];
        if (layer.empty())
            continue;
        memcpy(&Layers[0][n], &layer[0], layer.Size * sizeof(ImDrawList*));
        n += layer.Size;
        layer.resize(0);
    }
}